

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::CurrentProgramBindingTestCase::test
          (CurrentProgramBindingTestCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  ResultCollector *pRVar1;
  deBool dVar2;
  TestLog *pTVar3;
  Enum<int,_2UL> EVar4;
  GetNameFunc local_770;
  int local_768;
  string local_760;
  allocator<char> local_739;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  GLenum local_6b8;
  allocator<char> local_6b1;
  deUint32 err_5;
  allocator<char> local_689;
  string local_688;
  ScopedLogSection local_668;
  ScopedLogSection section_5;
  TestLog *local_650;
  int local_648;
  string local_640;
  allocator<char> local_619;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  GLenum local_598;
  allocator<char> local_591;
  deUint32 err_4;
  allocator<char> local_569;
  string local_568;
  ScopedLogSection local_548;
  ScopedLogSection section_4;
  TestLog *local_530;
  int local_528;
  string local_520;
  allocator<char> local_4f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  GLenum local_478;
  allocator<char> local_471;
  deUint32 err_3;
  GetNameFunc local_450;
  int local_448;
  GetNameFunc local_440;
  int local_438;
  string local_430;
  allocator<char> local_409;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  GLenum local_388;
  allocator<char> local_381;
  deUint32 err_2;
  allocator<char> local_359;
  string local_358;
  ScopedLogSection local_338;
  ScopedLogSection section_3;
  string local_328;
  GetNameFunc local_308;
  int local_300;
  GetNameFunc local_2f8;
  int local_2f0;
  string local_2e8;
  allocator<char> local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  GLenum local_240;
  allocator<char> local_239;
  deUint32 err_1;
  allocator<char> local_211;
  string local_210;
  ScopedLogSection local_1f0;
  ScopedLogSection section_2;
  string local_1e0;
  GetNameFunc local_1c0;
  int local_1b8;
  GetNameFunc local_1b0;
  int local_1a8;
  string local_1a0;
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  GLenum local_f8;
  allocator<char> local_f1;
  deUint32 err;
  allocator<char> local_c9;
  string local_c8;
  ScopedLogSection local_a8;
  ScopedLogSection section_1;
  string local_98;
  allocator<char> local_61;
  string local_60;
  ScopedLogSection local_40;
  ScopedLogSection section;
  int local_30;
  GLint linkStatus;
  GLint compileStatus;
  GLuint shaderProg;
  GLuint shaderFrag;
  GLuint shaderVert;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  CurrentProgramBindingTestCase *this_local;
  
  _shaderFrag = result;
  result_local = (ResultCollector *)gl;
  gl_local = (CallLogWrapper *)this;
  pTVar3 = glu::CallLogWrapper::getLog(gl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Initial",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Initial",(allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_40,pTVar3,&local_60,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (_shaderFrag,(CallLogWrapper *)result_local,0x8b8d,0,(this->super_BindingTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&local_40);
  pTVar3 = glu::CallLogWrapper::getLog((CallLogWrapper *)result_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"VertexShader",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&err,"Vertex Shader",&local_f1);
  tcu::ScopedLogSection::ScopedLogSection(&local_a8,pTVar3,&local_c8,(string *)&err);
  std::__cxx11::string::~string((string *)&err);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  shaderProg = glu::CallLogWrapper::glCreateShader((CallLogWrapper *)result_local,0x8b31);
  glu::CallLogWrapper::glShaderSource
            ((CallLogWrapper *)result_local,shaderProg,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader((CallLogWrapper *)result_local,shaderProg);
  do {
    local_f8 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = _shaderFrag;
    if (local_f8 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"Got Error ",&local_179);
      EVar4 = glu::getErrorStr(local_f8);
      local_1c0 = EVar4.m_getName;
      local_1b8 = EVar4.m_value;
      local_1b0 = local_1c0;
      local_1a8 = local_1b8;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1a0,&local_1b0);
      std::operator+(&local_158,&local_178,&local_1a0);
      std::operator+(&local_138,&local_158,": ");
      std::operator+(&local_118,&local_138,"glCompileShader");
      tcu::ResultCollector::fail(pRVar1,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator(&local_179);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  glu::CallLogWrapper::glGetShaderiv((CallLogWrapper *)result_local,shaderProg,0x8b81,&local_30);
  pRVar1 = _shaderFrag;
  if (local_30 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"expected GL_TRUE",
               (allocator<char> *)((long)&section_2.m_log + 7));
    tcu::ResultCollector::fail(pRVar1,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_a8);
  pTVar3 = glu::CallLogWrapper::getLog((CallLogWrapper *)result_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"FragmentShader",&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&err_1,"Fragment Shader",&local_239);
  tcu::ScopedLogSection::ScopedLogSection(&local_1f0,pTVar3,&local_210,(string *)&err_1);
  std::__cxx11::string::~string((string *)&err_1);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  compileStatus = glu::CallLogWrapper::glCreateShader((CallLogWrapper *)result_local,0x8b30);
  glu::CallLogWrapper::glShaderSource
            ((CallLogWrapper *)result_local,compileStatus,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader((CallLogWrapper *)result_local,compileStatus);
  do {
    local_240 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = _shaderFrag;
    if (local_240 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c0,"Got Error ",&local_2c1);
      EVar4 = glu::getErrorStr(local_240);
      local_308 = EVar4.m_getName;
      local_300 = EVar4.m_value;
      local_2f8 = local_308;
      local_2f0 = local_300;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2e8,&local_2f8);
      std::operator+(&local_2a0,&local_2c0,&local_2e8);
      std::operator+(&local_280,&local_2a0,": ");
      std::operator+(&local_260,&local_280,"glCompileShader");
      tcu::ResultCollector::fail(pRVar1,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  glu::CallLogWrapper::glGetShaderiv((CallLogWrapper *)result_local,compileStatus,0x8b81,&local_30);
  pRVar1 = _shaderFrag;
  if (local_30 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"expected GL_TRUE",
               (allocator<char> *)((long)&section_3.m_log + 7));
    tcu::ResultCollector::fail(pRVar1,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_3.m_log + 7));
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_1f0);
  pTVar3 = glu::CallLogWrapper::getLog((CallLogWrapper *)result_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"Program",&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err_2,"Create and bind program",&local_381);
  tcu::ScopedLogSection::ScopedLogSection(&local_338,pTVar3,&local_358,(string *)&err_2);
  std::__cxx11::string::~string((string *)&err_2);
  std::allocator<char>::~allocator(&local_381);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  linkStatus = glu::CallLogWrapper::glCreateProgram((CallLogWrapper *)result_local);
  glu::CallLogWrapper::glAttachShader((CallLogWrapper *)result_local,linkStatus,shaderProg);
  glu::CallLogWrapper::glAttachShader((CallLogWrapper *)result_local,linkStatus,compileStatus);
  glu::CallLogWrapper::glLinkProgram((CallLogWrapper *)result_local,linkStatus);
  do {
    local_388 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = _shaderFrag;
    if (local_388 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,"Got Error ",&local_409);
      EVar4 = glu::getErrorStr(local_388);
      local_450 = EVar4.m_getName;
      local_448 = EVar4.m_value;
      local_440 = local_450;
      local_438 = local_448;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_430,&local_440);
      std::operator+(&local_3e8,&local_408,&local_430);
      std::operator+(&local_3c8,&local_3e8,": ");
      std::operator+(&local_3a8,&local_3c8,"glLinkProgram");
      tcu::ResultCollector::fail(pRVar1,&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator(&local_409);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  glu::CallLogWrapper::glGetProgramiv
            ((CallLogWrapper *)result_local,linkStatus,0x8b82,(GLint *)((long)&section.m_log + 4));
  pRVar1 = _shaderFrag;
  if (section.m_log._4_4_ != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err_3,"expected GL_TRUE",&local_471);
    tcu::ResultCollector::fail(pRVar1,(string *)&err_3);
    std::__cxx11::string::~string((string *)&err_3);
    std::allocator<char>::~allocator(&local_471);
  }
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)result_local,linkStatus);
  do {
    local_478 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = _shaderFrag;
    if (local_478 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f8,"Got Error ",&local_4f9);
      EVar4 = glu::getErrorStr(local_478);
      section_4.m_log = (TestLog *)EVar4.m_getName;
      local_528 = EVar4.m_value;
      local_530 = section_4.m_log;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_520,&local_530);
      std::operator+(&local_4d8,&local_4f8,&local_520);
      std::operator+(&local_4b8,&local_4d8,": ");
      std::operator+(&local_498,&local_4b8,"glUseProgram");
      tcu::ResultCollector::fail(pRVar1,&local_498);
      std::__cxx11::string::~string((string *)&local_498);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::allocator<char>::~allocator(&local_4f9);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (_shaderFrag,(CallLogWrapper *)result_local,0x8b8d,linkStatus,
             (this->super_BindingTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&local_338);
  pTVar3 = glu::CallLogWrapper::getLog((CallLogWrapper *)result_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"Delete",&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err_4,"Delete program while in use",&local_591);
  tcu::ScopedLogSection::ScopedLogSection(&local_548,pTVar3,&local_568,(string *)&err_4);
  std::__cxx11::string::~string((string *)&err_4);
  std::allocator<char>::~allocator(&local_591);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  glu::CallLogWrapper::glDeleteShader((CallLogWrapper *)result_local,shaderProg);
  glu::CallLogWrapper::glDeleteShader((CallLogWrapper *)result_local,compileStatus);
  glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)result_local,linkStatus);
  do {
    local_598 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = _shaderFrag;
    if (local_598 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_618,"Got Error ",&local_619);
      EVar4 = glu::getErrorStr(local_598);
      section_5.m_log = (TestLog *)EVar4.m_getName;
      local_648 = EVar4.m_value;
      local_650 = section_5.m_log;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_640,&local_650);
      std::operator+(&local_5f8,&local_618,&local_640);
      std::operator+(&local_5d8,&local_5f8,": ");
      std::operator+(&local_5b8,&local_5d8,"glDeleteProgram");
      tcu::ResultCollector::fail(pRVar1,&local_5b8);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::__cxx11::string::~string((string *)&local_640);
      std::__cxx11::string::~string((string *)&local_618);
      std::allocator<char>::~allocator(&local_619);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (_shaderFrag,(CallLogWrapper *)result_local,0x8b8d,linkStatus,
             (this->super_BindingTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&local_548);
  pTVar3 = glu::CallLogWrapper::getLog((CallLogWrapper *)result_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"Unbind",&local_689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&err_5,"Unbind program",&local_6b1);
  tcu::ScopedLogSection::ScopedLogSection(&local_668,pTVar3,&local_688,(string *)&err_5);
  std::__cxx11::string::~string((string *)&err_5);
  std::allocator<char>::~allocator(&local_6b1);
  std::__cxx11::string::~string((string *)&local_688);
  std::allocator<char>::~allocator(&local_689);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)result_local,0);
  do {
    local_6b8 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = _shaderFrag;
    if (local_6b8 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_738,"Got Error ",&local_739);
      EVar4 = glu::getErrorStr(local_6b8);
      local_770 = EVar4.m_getName;
      local_768 = EVar4.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_760,&local_770);
      std::operator+(&local_718,&local_738,&local_760);
      std::operator+(&local_6f8,&local_718,": ");
      std::operator+(&local_6d8,&local_6f8,"glUseProgram");
      tcu::ResultCollector::fail(pRVar1,&local_6d8);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&local_760);
      std::__cxx11::string::~string((string *)&local_738);
      std::allocator<char>::~allocator(&local_739);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (_shaderFrag,(CallLogWrapper *)result_local,0x8b8d,0,(this->super_BindingTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&local_668);
  return;
}

Assistant:

void test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
	{
		static const char* testVertSource =
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0);\n"
			"}\n";
		static const char* testFragSource =
			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0);\n"
			"}\n";

		GLuint	shaderVert;
		GLuint	shaderFrag;
		GLuint	shaderProg;
		GLint	compileStatus;
		GLint	linkStatus;

		{
			const tcu::ScopedLogSection section(gl.getLog(), "Initial", "Initial");

			verifyStateInteger(result, gl, GL_CURRENT_PROGRAM, 0, m_type);
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "VertexShader", "Vertex Shader");

			shaderVert = gl.glCreateShader(GL_VERTEX_SHADER);
			gl.glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
			gl.glCompileShader(shaderVert);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glCompileShader");

			gl.glGetShaderiv(shaderVert, GL_COMPILE_STATUS, &compileStatus);
			if (compileStatus != GL_TRUE)
				result.fail("expected GL_TRUE");
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "FragmentShader", "Fragment Shader");

			shaderFrag = gl.glCreateShader(GL_FRAGMENT_SHADER);
			gl.glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);
			gl.glCompileShader(shaderFrag);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glCompileShader");

			gl.glGetShaderiv(shaderFrag, GL_COMPILE_STATUS, &compileStatus);
			if (compileStatus != GL_TRUE)
				result.fail("expected GL_TRUE");
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "Program", "Create and bind program");

			shaderProg = gl.glCreateProgram();
			gl.glAttachShader(shaderProg, shaderVert);
			gl.glAttachShader(shaderProg, shaderFrag);
			gl.glLinkProgram(shaderProg);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glLinkProgram");

			gl.glGetProgramiv(shaderProg, GL_LINK_STATUS, &linkStatus);
			if (linkStatus != GL_TRUE)
				result.fail("expected GL_TRUE");

			gl.glUseProgram(shaderProg);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glUseProgram");

			verifyStateInteger(result, gl, GL_CURRENT_PROGRAM, shaderProg, m_type);
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "Delete", "Delete program while in use");

			gl.glDeleteShader(shaderVert);
			gl.glDeleteShader(shaderFrag);
			gl.glDeleteProgram(shaderProg);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteProgram");

			verifyStateInteger(result, gl, GL_CURRENT_PROGRAM, shaderProg, m_type);
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "Unbind", "Unbind program");
			gl.glUseProgram(0);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glUseProgram");

			verifyStateInteger(result, gl, GL_CURRENT_PROGRAM, 0, m_type);
		}
	}